

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O1

bool __thiscall
cmWhileFunctionBlocker::Replay
          (cmWhileFunctionBlocker *this,
          vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions,
          cmExecutionStatus *inStatus)

{
  long *plVar1;
  pointer pcVar2;
  bool bVar3;
  char cVar4;
  PolicyStatus PVar5;
  string *psVar6;
  cmake *this_00;
  PolicyID id;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  cmExpandedCommandArgument *pcVar8;
  cmListFileFunction *lff;
  WrapQuotes in_R8D;
  pointer pcVar9;
  byte bVar10;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view str;
  MessageType messageType;
  string err;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  cmExecutionStatus status;
  string errorString;
  cmListFileBacktrace whileBT;
  cmConditionEvaluator conditionEvaluator;
  MessageType local_254;
  cmMakefile *local_250;
  undefined1 local_248 [40];
  cmWhileFunctionBlocker *local_220;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> local_218;
  undefined1 local_1f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  undefined8 local_1d0;
  undefined1 local_1c8 [16];
  pointer pbStack_1b8;
  undefined1 local_1b0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_188;
  cmListFileBacktrace local_178;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_168;
  bool local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *local_128;
  cmListFileFunction *local_120;
  string local_118;
  string local_f8;
  undefined1 local_d8 [56];
  cmListFileContext local_a0;
  
  local_250 = inStatus->Makefile;
  local_128 = functions;
  cmMakefile::GetBacktrace(local_250);
  local_220 = this;
  cmListFileContext::cmListFileContext(&local_a0,&(this->super_cmFunctionBlocker).StartingContext);
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
            (&local_188,(cmListFileContext *)local_1f8);
  if ((local_a0.DeferId.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_engaged == true) &&
     (local_a0.DeferId.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false,
     local_a0.DeferId.
     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
     ._M_payload.
     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
     .
     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ._M_payload._M_value._M_dataplus._M_p !=
     ((pointer)
     ((long)&local_a0.DeferId.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     + 0x10U))._M_p)) {
    operator_delete((void *)local_a0.DeferId.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p,
                    local_a0.DeferId.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.FilePath._M_dataplus._M_p != &local_a0.FilePath.field_2) {
    operator_delete(local_a0.FilePath._M_dataplus._M_p,
                    local_a0.FilePath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.Name._M_dataplus._M_p != &local_a0.Name.field_2) {
    operator_delete(local_a0.Name._M_dataplus._M_p,local_a0.Name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._8_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
  }
  local_218.
  super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>._M_impl.
  super__Vector_impl_data._M_start = (cmExpandedCommandArgument *)0x0;
  local_218.
  super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = (cmExpandedCommandArgument *)0x0;
  local_218.
  super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::reserve
            (&local_218,
             ((long)(local_220->Args).
                    super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(local_220->Args).
                    super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  local_1b0._8_8_ = &local_198;
  local_1b0._16_8_ = 0;
  local_198._M_local_buf[0] = '\0';
  local_178.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_188.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_178.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_188.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_188.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_188.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_188.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_188.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_188.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  cmConditionEvaluator::cmConditionEvaluator((cmConditionEvaluator *)local_d8,local_250,&local_178);
  if (local_178.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_178.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_220 = (cmWhileFunctionBlocker *)&local_220->Args;
  do {
    do {
      pcVar9 = local_218.
               super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pcVar2 = local_218.
               super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_218.
          super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_218.
          super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        paVar7 = &((local_218.
                    super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                    ._M_impl.super__Vector_impl_data._M_start)->Value).field_2;
        do {
          plVar1 = (long *)(((string *)(paVar7 + -1))->_M_dataplus)._M_p;
          if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)plVar1) {
            operator_delete(plVar1,paVar7->_M_allocated_capacity + 1);
          }
          pcVar8 = (cmExpandedCommandArgument *)((long)paVar7 + 0x18);
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)paVar7 + 0x28);
        } while (pcVar8 != pcVar9);
        local_218.
        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
        _M_impl.super__Vector_impl_data._M_finish = pcVar2;
      }
      cmMakefile::ExpandArguments
                (local_250,
                 (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_220,
                 &local_218);
      bVar3 = cmConditionEvaluator::IsTrue
                        ((cmConditionEvaluator *)local_d8,&local_218,(string *)(local_1b0 + 8),
                         &local_254);
      if (!bVar3) {
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._16_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._16_8_);
        }
        goto LAB_004479aa;
      }
      lff = (local_128->super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>)
            ._M_impl.super__Vector_impl_data._M_start;
      local_120 = (local_128->
                  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
    } while (lff == local_120);
    do {
      local_1f8._0_8_ = local_250;
      local_1e0._8_6_ = 0x2e726f727265;
      local_1e0._0_6_ = 0x776f6e6b6e75;
      local_1e0._6_2_ = 0x206e;
      local_1f8._16_8_ = (string *)0xe;
      local_1e0._M_local_buf[0xe] = '\0';
      local_1c8._0_8_ = local_1c8._0_8_ & 0xffffffffffffff00;
      local_1c8._8_8_ = (pointer)0x0;
      pbStack_1b8 = (pointer)0x0;
      local_1b0._0_8_ = (pointer)0x0;
      local_1d0 = local_1d0 & 0xffffffff00000000;
      local_148 = false;
      local_1f8._8_8_ = &local_1e0;
      cmMakefile::ExecuteCommand
                (local_250,lff,(cmExecutionStatus *)local_1f8,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_168);
      if ((local_148 == true) &&
         (local_148 = false,
         local_168._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_168._M_value + 0x10))) {
        operator_delete((void *)local_168._M_value._M_dataplus._M_p,local_168._16_8_ + 1);
      }
      if (local_1d0._0_1_ == true) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_140,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_1c8 + 8));
        local_248._0_8_ =
             (inStatus->Variables).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_248._8_8_ =
             (inStatus->Variables).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_248._16_8_ =
             (inStatus->Variables).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (inStatus->Variables).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_140.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (inStatus->Variables).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_140.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (inStatus->Variables).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_140.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_140.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_140.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_140.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_248);
        inStatus->ReturnInvoked = true;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_140);
        cVar4 = '\x01';
LAB_0044790f:
        bVar10 = 0;
      }
      else {
        cVar4 = '\x01';
        if (local_1d0._1_1_ != false) goto LAB_0044790f;
        if (local_1d0._2_1_ != false) {
          cVar4 = '\x04';
          goto LAB_0044790f;
        }
        if (local_1c8[0] == '\x01') {
          (inStatus->ExitCode).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int> =
               (_Optional_payload_base<int>)(local_1d0 >> 0x20 | 0x100000000);
          goto LAB_0044790f;
        }
        cVar4 = true;
        if (cmSystemTools::s_FatalErrorOccurred == false) {
          cVar4 = cmSystemTools::GetInterruptFlag();
        }
        bVar10 = cVar4 ^ 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1c8 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._8_8_ != &local_1e0) {
        operator_delete((void *)local_1f8._8_8_,CONCAT26(local_1e0._6_2_,local_1e0._0_6_) + 1);
      }
      if (bVar10 == 0) goto LAB_00447970;
      lff = lff + 1;
    } while (lff != local_120);
    cVar4 = '\x04';
LAB_00447970:
  } while (cVar4 == '\x04');
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._16_8_);
  }
  if (bVar3) goto LAB_00447c07;
LAB_004479aa:
  if (local_1b0._16_8_ != 0 && !bVar3) {
    PVar5 = cmMakefile::GetPolicyStatus(local_250,CMP0130,false);
    if (2 < PVar5 - NEW) {
      if (PVar5 != WARN) goto LAB_004479e2;
      local_254 = AUTHOR_WARNING;
    }
    bVar3 = true;
  }
LAB_004479e2:
  if ((bVar3 != false) && (local_1b0._16_8_ != 0)) {
    local_248._0_8_ = local_248 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_248,"while() given incorrect arguments:\n ","");
    pcVar2 = local_218.
             super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_218.
        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_218.
        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pcVar9 = local_218.
               super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::__cxx11::string::append(local_248);
        psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
        str._M_str = (char *)0x0;
        str._M_len = (size_t)(psVar6->_M_dataplus)._M_p;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  ((string *)local_1f8,(cmOutputConverter *)psVar6->_M_string_length,str,in_R8D);
        std::__cxx11::string::_M_append(local_248,local_1f8._0_8_);
        if ((cmMakefile *)local_1f8._0_8_ != (cmMakefile *)(local_1f8 + 0x10)) {
          operator_delete((void *)local_1f8._0_8_,(ulong)(local_1f8._16_8_ + 1));
        }
        pcVar9 = pcVar9 + 1;
      } while (pcVar9 != pcVar2);
    }
    std::__cxx11::string::append(local_248);
    std::__cxx11::string::_M_append(local_248,local_1b0._8_8_);
    PVar5 = cmMakefile::GetPolicyStatus(local_250,CMP0130,false);
    if (PVar5 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_118,(cmPolicies *)0x82,id);
      local_1f8._0_8_ = local_118._M_string_length;
      local_1f8._8_8_ = local_118._M_dataplus._M_p;
      local_d8._16_8_ = local_d8 + 0x18;
      local_d8._0_8_ = (cmMakefile *)0x0;
      local_d8._8_8_ = &DAT_00000001;
      local_d8[0x18] = 10;
      local_1e0._0_6_ = 1;
      local_1e0._6_2_ = 0;
      local_1e0._8_6_ = (undefined6)local_d8._16_8_;
      local_1e0._M_local_buf[0xe] = (char)((ulong)local_d8._16_8_ >> 0x30);
      local_1e0._M_local_buf[0xf] = (char)((ulong)local_d8._16_8_ >> 0x38);
      local_1d0 = 0;
      local_1c8._0_8_ = local_248._8_8_;
      local_1c8._8_8_ = local_248._0_8_;
      pbStack_1b8 = (pointer)0x0;
      views._M_len = 3;
      views._M_array = (iterator)local_1f8;
      local_1f8._16_8_ = &local_118;
      cmCatViews(&local_f8,views);
      std::__cxx11::string::operator=((string *)local_248,(string *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
    this_00 = cmMakefile::GetCMakeInstance(local_250);
    cmake::IssueMessage(this_00,local_254,(string *)local_248,(cmListFileBacktrace *)&local_188);
    if (local_254 == FATAL_ERROR) {
      cmSystemTools::s_FatalErrorOccurred = true;
    }
    if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
      operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
    }
  }
LAB_00447c07:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._8_8_ != &local_198) {
    operator_delete((void *)local_1b0._8_8_,
                    CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1);
  }
  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~vector
            (&local_218);
  if (local_188.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return true;
}

Assistant:

bool cmWhileFunctionBlocker::Replay(std::vector<cmListFileFunction> functions,
                                    cmExecutionStatus& inStatus)
{
  auto& mf = inStatus.GetMakefile();

  cmListFileBacktrace whileBT =
    mf.GetBacktrace().Push(this->GetStartingContext());

  std::vector<cmExpandedCommandArgument> expandedArguments;
  // At least same size expected for `expandedArguments` as `Args`
  expandedArguments.reserve(this->Args.size());

  auto expandArgs = [&mf](std::vector<cmListFileArgument> const& args,
                          std::vector<cmExpandedCommandArgument>& out)
    -> std::vector<cmExpandedCommandArgument>& {
    out.clear();
    mf.ExpandArguments(args, out);
    return out;
  };

  // For compatibility with projects that do not set CMP0130 to NEW,
  // we tolerate condition errors that evaluate to false.
  bool enforceError = true;
  std::string errorString;
  MessageType messageType;

  for (cmConditionEvaluator conditionEvaluator(mf, whileBT);
       (enforceError = /* enforce condition errors that evaluate to true */
        conditionEvaluator.IsTrue(expandArgs(this->Args, expandedArguments),
                                  errorString, messageType));) {
    // Invoke all the functions that were collected in the block.
    for (cmListFileFunction const& fn : functions) {
      cmExecutionStatus status(mf);
      mf.ExecuteCommand(fn, status);
      if (status.GetReturnInvoked()) {
        inStatus.SetReturnInvoked(status.GetReturnVariables());
        return true;
      }
      if (status.GetBreakInvoked()) {
        return true;
      }
      if (status.GetContinueInvoked()) {
        break;
      }
      if (status.HasExitCode()) {
        inStatus.SetExitCode(status.GetExitCode());
        return true;
      }
      if (cmSystemTools::GetFatalErrorOccurred()) {
        return true;
      }
    }
  }

  if (!errorString.empty() && !enforceError) {
    // This error should only be enforced if CMP0130 is NEW.
    switch (mf.GetPolicyStatus(cmPolicies::CMP0130)) {
      case cmPolicies::WARN:
        // Convert the error to a warning and enforce it.
        messageType = MessageType::AUTHOR_WARNING;
        enforceError = true;
        break;
      case cmPolicies::OLD:
        // OLD behavior is to silently ignore the error.
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        // NEW behavior is to enforce the error.
        enforceError = true;
        break;
    }
  }

  if (!errorString.empty() && enforceError) {
    std::string err = "while() given incorrect arguments:\n ";
    for (auto const& i : expandedArguments) {
      err += " ";
      err += cmOutputConverter::EscapeForCMake(i.GetValue());
    }
    err += "\n";
    err += errorString;
    if (mf.GetPolicyStatus(cmPolicies::CMP0130) == cmPolicies::WARN) {
      err =
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0130), '\n', err);
    }
    mf.GetCMakeInstance()->IssueMessage(messageType, err, whileBT);
    if (messageType == MessageType::FATAL_ERROR) {
      cmSystemTools::SetFatalErrorOccurred();
    }
  }

  return true;
}